

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O0

void ImGui_ImplSDL2_NewFrame(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ImGui_ImplSDL2_Data *pIVar4;
  ImGuiIO *this;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Uint64 current_time;
  int display_h;
  int display_w;
  int h;
  int w;
  ImGuiIO *io;
  ImGui_ImplSDL2_Data *bd;
  float local_54;
  Uint64 local_48;
  ImVec2 local_30;
  ImVec2 local_28;
  int local_20;
  int local_1c;
  float in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  
  pIVar4 = ImGui_ImplSDL2_GetBackendData();
  this = ImGui::GetIO();
  SDL_GetWindowSize(pIVar4->Window,&stack0xffffffffffffffec,&stack0xffffffffffffffe8);
  uVar1 = SDL_GetWindowFlags(pIVar4->Window);
  if ((uVar1 & 0x40) != 0) {
    in_stack_ffffffffffffffe8 = 0.0;
    in_stack_ffffffffffffffec = 0.0;
  }
  if (pIVar4->Renderer == (SDL_Renderer *)0x0) {
    SDL_GL_GetDrawableSize(pIVar4->Window,&local_1c,&local_20);
  }
  else {
    SDL_GetRendererOutputSize(pIVar4->Renderer,&local_1c,&local_20);
  }
  ImVec2::ImVec2(&local_28,(float)(int)in_stack_ffffffffffffffec,
                 (float)(int)in_stack_ffffffffffffffe8);
  this->DisplaySize = local_28;
  if ((0 < (int)in_stack_ffffffffffffffec) && (0 < (int)in_stack_ffffffffffffffe8)) {
    ImVec2::ImVec2(&local_30,(float)local_1c / (float)(int)in_stack_ffffffffffffffec,
                   (float)local_20 / (float)(int)in_stack_ffffffffffffffe8);
    this->DisplayFramebufferScale = local_30;
  }
  if (ImGui_ImplSDL2_NewFrame()::frequency == '\0') {
    iVar2 = __cxa_guard_acquire(&ImGui_ImplSDL2_NewFrame()::frequency);
    if (iVar2 != 0) {
      ImGui_ImplSDL2_NewFrame::frequency = SDL_GetPerformanceFrequency();
      __cxa_guard_release(&ImGui_ImplSDL2_NewFrame()::frequency);
    }
  }
  local_48 = SDL_GetPerformanceCounter();
  if (local_48 <= pIVar4->Time) {
    local_48 = pIVar4->Time + 1;
  }
  if (pIVar4->Time == 0) {
    local_54 = 0.016666668;
  }
  else {
    lVar5 = local_48 - pIVar4->Time;
    auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = 0x45300000;
    auVar7._8_4_ = (int)(ImGui_ImplSDL2_NewFrame::frequency >> 0x20);
    auVar7._0_8_ = ImGui_ImplSDL2_NewFrame::frequency;
    auVar7._12_4_ = 0x45300000;
    local_54 = (float)(((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) /
                      ((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)ImGui_ImplSDL2_NewFrame::frequency) -
                      4503599627370496.0)));
  }
  this->DeltaTime = local_54;
  pIVar4->Time = local_48;
  if (pIVar4->MouseLastLeaveFrame != 0) {
    iVar2 = pIVar4->MouseLastLeaveFrame;
    iVar3 = ImGui::GetFrameCount();
    if ((iVar3 <= iVar2) && (pIVar4->MouseButtonsDown == 0)) {
      pIVar4->MouseWindowID = 0;
      pIVar4->MouseLastLeaveFrame = 0;
      ImGuiIO::AddMousePosEvent(this,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
    }
  }
  ImGui_ImplSDL2_UpdateMouseData();
  ImGui_ImplSDL2_UpdateMouseCursor();
  ImGui_ImplSDL2_UpdateGamepads();
  return;
}

Assistant:

void ImGui_ImplSDL2_NewFrame()
{
    ImGui_ImplSDL2_Data* bd = ImGui_ImplSDL2_GetBackendData();
    IM_ASSERT(bd != nullptr && "Context or backend not initialized! Did you call ImGui_ImplSDL2_Init()?");
    ImGuiIO& io = ImGui::GetIO();

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    SDL_GetWindowSize(bd->Window, &w, &h);
    if (SDL_GetWindowFlags(bd->Window) & SDL_WINDOW_MINIMIZED)
        w = h = 0;
    if (bd->Renderer != nullptr)
        SDL_GetRendererOutputSize(bd->Renderer, &display_w, &display_h);
    else
        SDL_GL_GetDrawableSize(bd->Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / w, (float)display_h / h);

    // Setup time step (we don't use SDL_GetTicks() because it is using millisecond resolution)
    // (Accept SDL_GetPerformanceCounter() not returning a monotonically increasing value. Happens in VMs and Emscripten, see #6189, #6114, #3644)
    static Uint64 frequency = SDL_GetPerformanceFrequency();
    Uint64 current_time = SDL_GetPerformanceCounter();
    if (current_time <= bd->Time)
        current_time = bd->Time + 1;
    io.DeltaTime = bd->Time > 0 ? (float)((double)(current_time - bd->Time) / frequency) : (float)(1.0f / 60.0f);
    bd->Time = current_time;

    if (bd->MouseLastLeaveFrame && bd->MouseLastLeaveFrame >= ImGui::GetFrameCount() && bd->MouseButtonsDown == 0)
    {
        bd->MouseWindowID = 0;
        bd->MouseLastLeaveFrame = 0;
        io.AddMousePosEvent(-FLT_MAX, -FLT_MAX);
    }

    ImGui_ImplSDL2_UpdateMouseData();
    ImGui_ImplSDL2_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplSDL2_UpdateGamepads();
}